

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O3

void plutovg_path_add_ellipse(plutovg_path_t *path,float cx,float cy,float rx,float ry)

{
  plutovg_path_element_t *ppVar1;
  float y2;
  float fVar2;
  float y1;
  float y2_00;
  float x2;
  float y1_00;
  float x2_00;
  
  x2 = cx - rx;
  y1_00 = cy - ry;
  x2_00 = cx + rx;
  y2 = cy + ry;
  plutovg_path_reserve(path,0x14);
  ppVar1 = plutovg_path_add_command(path,PLUTOVG_PATH_COMMAND_MOVE_TO,1);
  (ppVar1->point).x = cx;
  (ppVar1->point).y = y1_00;
  (path->start_point).x = cx;
  (path->start_point).y = y1_00;
  path->num_contours = path->num_contours + 1;
  fVar2 = rx * 0.5522848 + cx;
  y2_00 = cy - ry * 0.5522848;
  plutovg_path_cubic_to(path,fVar2,y1_00,x2_00,y2_00,x2_00,cy);
  y1 = ry * 0.5522848 + cy;
  plutovg_path_cubic_to(path,x2_00,y1,fVar2,y2,cx,y2);
  fVar2 = cx - rx * 0.5522848;
  plutovg_path_cubic_to(path,fVar2,y2,x2,y1,x2,cy);
  plutovg_path_cubic_to(path,x2,y2_00,fVar2,y1_00,cx,y1_00);
  if ((path->elements).size != 0) {
    ppVar1 = plutovg_path_add_command(path,PLUTOVG_PATH_COMMAND_CLOSE,1);
    *ppVar1 = *(plutovg_path_element_t *)&path->start_point;
  }
  return;
}

Assistant:

void plutovg_path_add_ellipse(plutovg_path_t* path, float cx, float cy, float rx, float ry)
{
    float left = cx - rx;
    float top = cy - ry;
    float right = cx + rx;
    float bottom = cy + ry;

    float cpx = rx * PLUTOVG_KAPPA;
    float cpy = ry * PLUTOVG_KAPPA;

    plutovg_path_reserve(path, 2 * 2 + 4 * 4);
    plutovg_path_move_to(path, cx, top);
    plutovg_path_cubic_to(path, cx+cpx, top, right, cy-cpy, right, cy);
    plutovg_path_cubic_to(path, right, cy+cpy, cx+cpx, bottom, cx, bottom);
    plutovg_path_cubic_to(path, cx-cpx, bottom, left, cy+cpy, left, cy);
    plutovg_path_cubic_to(path, left, cy-cpy, cx-cpx, top, cx, top);
    plutovg_path_close(path);
}